

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

void readDeepScanLine(DeepScanLineInputPart *in,DeepFrameBuffer *buf,
                     vector<double,_std::allocator<double>_> *samplePerf,
                     vector<double,_std::allocator<double>_> *countPerf)

{
  int iVar1;
  long lVar2;
  long lVar3;
  double local_38;
  
  Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)in);
  Imf_3_4::DeepScanLineInputPart::header();
  lVar2 = Imf_3_4::Header::dataWindow();
  iVar1 = *(int *)(lVar2 + 4);
  lVar2 = std::chrono::_V2::steady_clock::now();
  Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)in,iVar1);
  lVar3 = std::chrono::_V2::steady_clock::now();
  local_38 = (double)(lVar3 - lVar2) / 1000000000.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(countPerf,&local_38);
  lVar2 = std::chrono::_V2::steady_clock::now();
  Imf_3_4::DeepScanLineInputPart::readPixels((int)in,iVar1);
  lVar3 = std::chrono::_V2::steady_clock::now();
  local_38 = (double)(lVar3 - lVar2) / 1000000000.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(samplePerf,&local_38);
  return;
}

Assistant:

void
readDeepScanLine (
    DeepScanLineInputPart& in,
    DeepFrameBuffer&       buf,
    vector<double>&        samplePerf,
    vector<double>&        countPerf)
{

    in.setFrameBuffer (buf);
    Box2i dw = in.header ().dataWindow ();

    steady_clock::time_point startCountRead = steady_clock::now ();
    in.readPixelSampleCounts (dw.min.y, dw.max.y);
    steady_clock::time_point endCountRead = steady_clock::now ();
    countPerf.push_back (timing (startCountRead, endCountRead));

    steady_clock::time_point startSampleRead = steady_clock::now ();
    in.readPixels (dw.min.y, dw.max.y);
    steady_clock::time_point endSampleRead = steady_clock::now ();
    samplePerf.push_back (timing (startSampleRead, endSampleRead));
}